

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

void __thiscall
QTextDocumentPrivate::insert(QTextDocumentPrivate *this,int pos,int strPos,int strLength,int format)

{
  Header *pHVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QTextUndoCommand local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < strLength) {
    insert_string(this,pos,strPos,strLength,format,MoveCursor);
    if (this->undoEnabled == true) {
      uVar2 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
      pHVar1 = (this->blocks).data.field_0.head;
      local_58._0_3_ = (uint3)(this->editBlock != 0) << 0x10;
      uVar3 = (ulong)uVar2;
      local_58.operation = '\x01';
      local_58.format = format;
      local_58.pos = pos;
      local_58.strPos = strPos;
      local_58.field_8._4_4_ = 0xaaaaaaaa;
      local_58.field_8.blockFormat = strLength;
      local_58._28_4_ = 0xaaaaaaaa;
      local_58.revision = *(int *)((long)pHVar1 + uVar3 * 0x48 + 0x44) * 2 >> 1;
      appendUndoItem(this,&local_58);
      *(uint *)((long)pHVar1 + uVar3 * 0x48 + 0x44) =
           *(uint *)((long)pHVar1 + uVar3 * 0x48 + 0x44) & 0x80000000 | this->revision & 0x7fffffffU
      ;
    }
    finishEdit(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::insert(int pos, int strPos, int strLength, int format)
{
    if (strLength <= 0)
        return;

    Q_ASSERT(pos >= 0 && pos < fragments.length());
    Q_ASSERT(formats.format(format).isCharFormat());

    insert_string(pos, strPos, strLength, format, QTextUndoCommand::MoveCursor);
    if (undoEnabled) {
        int b = blocks.findNode(pos);
        QTextBlockData *B = blocks.fragment(b);

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::Inserted, (editBlock != 0),
                                QTextUndoCommand::MoveCursor, format, strPos, pos, strLength,
                                B->revision);
        appendUndoItem(c);
        B->revision = revision;
        Q_ASSERT(undoState == undoStack.size());
    }
    finishEdit();
}